

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pnet.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined4 uVar1;
  float fVar2;
  char *pcVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  char cVar6;
  int iVar7;
  pair<int,_int> pVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  pointer pCVar11;
  int i_2;
  long lVar12;
  pointer pCVar13;
  void *pvVar14;
  int i;
  uint uVar15;
  int iVar16;
  size_type __n;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  float fVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar37;
  vector<float,_std::allocator<float>_> x_;
  Extractor ex;
  vector<int,_std::allocator<int>_> strides;
  vector<float,_std::allocator<float>_> all_anchor_points;
  vector<float,_std::allocator<float>_> y_;
  float norm_vals1 [3];
  vector<CrowdPoint,_std::allocator<CrowdPoint>_> crowd_points;
  float x;
  vector<float,_std::allocator<float>_> shifted_anchor_points;
  vector<float,_std::allocator<float>_> anchor_points;
  float mean_vals1 [3];
  vector<int,_std::allocator<int>_> pyramid_levels;
  Net net;
  Option opt;
  Mat bgr;
  value_type_conflict1 local_410;
  allocator_type local_409;
  undefined8 local_408;
  float fStack_400;
  float fStack_3fc;
  double local_3f0;
  Mat local_3e8;
  undefined1 local_398 [32];
  Allocator *local_378;
  undefined1 local_368 [8];
  iterator iStack_360;
  int *local_358;
  undefined1 local_348 [16];
  undefined8 local_338;
  undefined8 local_328;
  undefined8 uStack_320;
  Mat local_318;
  undefined1 local_2c8 [16];
  pair<int,_int> *local_2b8;
  vector<CrowdPoint,_std::allocator<CrowdPoint>_> local_2a8;
  Mat local_288;
  vector<float,_std::allocator<float>_> local_238;
  vector<float,_std::allocator<float>_> local_218;
  vector<float,_std::allocator<float>_> local_200;
  Mat local_1e8;
  double local_198;
  void *local_190;
  undefined4 local_188;
  undefined1 local_178 [16];
  pointer local_168;
  Net local_158;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  Option local_d0;
  string local_90 [16];
  uchar *local_80;
  long lVar33;
  
  if (argc == 2) {
    pcVar3 = argv[1];
    std::__cxx11::string::string((string *)&local_158,pcVar3,(allocator *)&local_1e8);
    cv::imread(local_90,(int)&local_158);
    if ((Allocator **)local_158._vptr_Net != &local_158.opt.blob_allocator) {
      operator_delete(local_158._vptr_Net);
    }
    cVar6 = cv::Mat::empty();
    if (cVar6 == '\0') {
      local_2a8.super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_2a8.super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2a8.super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ncnn::Option::Option(&local_d0);
      local_d0.num_threads = 4;
      local_d0.use_vulkan_compute = false;
      local_d0.use_bf16_storage = false;
      ncnn::Net::Net(&local_158);
      local_158.opt.num_threads = local_d0.num_threads;
      local_158.opt.lightmode = local_d0.lightmode;
      local_158.opt._1_3_ = local_d0._1_3_;
      local_158.opt.use_vulkan_compute = local_d0.use_vulkan_compute;
      local_158.opt.openmp_blocktime = local_d0.openmp_blocktime;
      local_158.opt.use_winograd_convolution = local_d0.use_winograd_convolution;
      local_158.opt.use_sgemm_convolution = local_d0.use_sgemm_convolution;
      local_158.opt.use_int8_inference = local_d0.use_int8_inference;
      local_158.opt.use_fp16_packed = local_d0.use_fp16_packed;
      local_158.opt.use_fp16_storage = local_d0.use_fp16_storage;
      local_158.opt.use_fp16_arithmetic = local_d0.use_fp16_arithmetic;
      local_158.opt.use_int8_packed = local_d0.use_int8_packed;
      local_158.opt.use_int8_storage = local_d0.use_int8_storage;
      local_158.opt.use_int8_arithmetic = local_d0.use_int8_arithmetic;
      local_158.opt.use_packing_layout = local_d0.use_packing_layout;
      local_158.opt.use_bf16_storage = local_d0.use_bf16_storage;
      local_158.opt.flush_denormals = local_d0.flush_denormals;
      local_158.opt.use_local_pool_allocator = local_d0.use_local_pool_allocator;
      local_158.opt.use_shader_local_memory = local_d0.use_shader_local_memory;
      local_158.opt.use_cooperative_matrix = local_d0.use_cooperative_matrix;
      local_158.opt.use_winograd23_convolution = local_d0.use_winograd23_convolution;
      local_158.opt.use_winograd43_convolution = local_d0.use_winograd43_convolution;
      local_158.opt.use_winograd63_convolution = local_d0.use_winograd63_convolution;
      local_158.opt.use_reserved_6 = local_d0.use_reserved_6;
      local_158.opt.use_reserved_7 = local_d0.use_reserved_7;
      local_158.opt.use_reserved_8 = local_d0.use_reserved_8;
      local_158.opt.use_reserved_9 = local_d0.use_reserved_9;
      local_158.opt.use_reserved_10 = local_d0.use_reserved_10;
      local_158.opt.use_reserved_11 = local_d0.use_reserved_11;
      local_158.opt.use_shader_pack8 = local_d0.use_shader_pack8;
      local_158.opt.use_subgroup_basic = local_d0.use_subgroup_basic;
      local_158.opt.use_subgroup_vote = local_d0.use_subgroup_vote;
      local_158.opt.use_subgroup_ballot = local_d0.use_subgroup_ballot;
      local_158.opt.use_subgroup_shuffle = local_d0.use_subgroup_shuffle;
      local_158.opt.use_image_storage = local_d0.use_image_storage;
      local_158.opt.use_tensor_storage = local_d0.use_tensor_storage;
      local_158.opt.use_reserved_0 = local_d0.use_reserved_0;
      local_158.opt.workspace_allocator = local_d0.workspace_allocator;
      local_158.opt.blob_allocator = local_d0.blob_allocator;
      iVar7 = ncnn::Net::load_param(&local_158,"p2pnet.param");
      if ((iVar7 != 0) || (iVar7 = ncnn::Net::load_model(&local_158,"p2pnet.bin"), iVar7 != 0)) {
        exit(-1);
      }
      iVar7 = (int)local_90._8_8_;
      iVar16 = SUB84(local_90._8_8_,4);
      local_e8 = CONCAT44(iVar7,iVar16);
      uStack_e0 = 0;
      local_f8 = (iVar16 / 0x80) * 0x80;
      iStack_f4 = (iVar7 / 0x80) * 0x80;
      iStack_f0 = 0;
      iStack_ec = 0;
      ncnn::Mat::from_pixels_resize
                (&local_1e8,local_80,0x10002,iVar16,iVar7,local_f8,iStack_f4,(Allocator *)0x0);
      local_178 = (undefined1  [16])0x0;
      local_168 = (pointer)0x0;
      local_178._0_8_ = operator_new(4);
      local_168 = (pointer)(local_178._0_8_ + 4);
      *(undefined4 *)local_178._0_8_ = 3;
      local_178._8_8_ = local_168;
      local_348 = (undefined1  [16])0x0;
      local_338 = 0;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)(local_398 + 0x18),
                 (vector<int,_std::allocator<int>_> *)local_178);
      local_2b8 = (pair<int,_int> *)0x0;
      local_2c8 = (undefined1  [16])0x0;
      local_358 = (int *)0x0;
      _local_368 = (undefined1  [16])0x0;
      if (local_378 != (Allocator *)local_398._24_8_) {
        local_3f0 = (double)local_1e8.h;
        local_198 = (double)local_1e8.w;
        uVar23 = 0;
        do {
          dVar27 = ldexp(1.0,*(int *)((long)(_func_int ***)local_398._24_8_ + uVar23 * 4));
          local_408._0_4_ = SUB84(dVar27,0);
          local_408._4_4_ = (float)((ulong)dVar27 >> 0x20);
          dVar27 = ldexp(1.0,*(int *)((long)(_func_int ***)local_398._24_8_ + uVar23 * 4));
          dVar27 = floor(((double)CONCAT44(local_408._4_4_,(float)local_408) + local_3f0 + -1.0) /
                         dVar27);
          local_408._0_4_ = SUB84(dVar27,0);
          local_408._4_4_ = (float)((ulong)dVar27 >> 0x20);
          local_328 = ldexp(1.0,*(int *)((long)(_func_int ***)local_398._24_8_ + uVar23 * 4));
          dVar28 = ldexp(1.0,*(int *)((long)(_func_int ***)local_398._24_8_ + uVar23 * 4));
          dVar27 = (double)CONCAT44(local_408._4_4_,(float)local_408);
          dVar28 = floor((local_328 + local_198 + -1.0) / dVar28);
          pVar8.first = (int)dVar28;
          pVar8.second = (int)dVar27;
          local_3e8.data = (void *)pVar8;
          if ((pair<int,_int> *)local_2c8._8_8_ == local_2b8) {
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            _M_realloc_insert<std::pair<int,int>>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)local_2c8,
                       (iterator)local_2c8._8_8_,(pair<int,_int> *)&local_3e8);
          }
          else {
            *(pair<int,_int> *)local_2c8._8_8_ = pVar8;
            local_2c8._8_8_ = (pair<int,_int> *)(local_2c8._8_8_ + 8);
          }
          dVar27 = ldexp(1.0,*(int *)((long)(_func_int ***)local_398._24_8_ + uVar23 * 4));
          local_3e8.data._0_4_ = (int)dVar27;
          if (iStack_360._M_current == local_358) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)local_368,iStack_360,(int *)&local_3e8);
          }
          else {
            *iStack_360._M_current = (int)dVar27;
            iStack_360._M_current = iStack_360._M_current + 1;
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 < (ulong)((long)local_378 - local_398._24_8_ >> 2));
      }
      if (local_348._8_8_ != local_348._0_8_) {
        local_348._8_8_ = local_348._0_8_;
      }
      if (local_378 != (Allocator *)local_398._24_8_) {
        dVar27 = 0.0;
        do {
          local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_3f0 = dVar27;
          dVar27 = ldexp(1.0,*(int *)((long)(_func_int ***)local_398._24_8_ + (long)dVar27 * 4));
          local_3e8.data = (void *)0x0;
          local_3e8.refcount = (int *)0x0;
          local_3e8.elemsize._0_4_ = 0;
          local_3e8.elemsize._4_4_ = 0;
          local_318.elemsize._0_4_ = 0;
          local_318.elemsize._4_4_ = 0;
          local_318.data = (undefined4 *)0x0;
          local_318.refcount._0_4_ = 0;
          local_318.refcount._4_4_ = 0;
          local_408 = (double)((float)(int)dVar27 * 0.5);
          local_328 = -(double)((int)dVar27 / 2);
          uStack_320 = 0x8000000000000000;
          iVar7 = 1;
          do {
            fVar26 = (float)(((double)iVar7 + -0.5) * local_408 + local_328);
            local_288.data = (void *)CONCAT44(local_288.data._4_4_,fVar26);
            if (local_3e8.refcount == (int *)local_3e8.elemsize) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_3e8,
                         (iterator)local_3e8.refcount,(float *)&local_288);
            }
            else {
              *local_3e8.refcount = (int)fVar26;
              local_3e8.refcount = (int *)((long)local_3e8.refcount + 4);
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != 3);
          iVar7 = 1;
          do {
            fVar26 = (float)(((double)iVar7 + -0.5) * local_408 + local_328);
            local_288.data = (void *)CONCAT44(local_288.data._4_4_,fVar26);
            if ((float *)local_318.refcount ==
                (float *)CONCAT44(local_318.elemsize._4_4_,(undefined4)local_318.elemsize)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_318,
                         (iterator)local_318.refcount,(float *)&local_288);
            }
            else {
              *local_318.refcount = (int)fVar26;
              local_318.refcount = (int *)((float *)local_318.refcount + 1);
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != 3);
          puVar9 = (undefined8 *)operator_new(0x10);
          *puVar9 = 0;
          puVar9[1] = 0;
          puVar10 = (undefined8 *)operator_new(0x10);
          *puVar10 = 0;
          puVar10[1] = 0;
          *(undefined4 *)puVar9 = *local_3e8.data;
          *(undefined4 *)((long)puVar9 + 4) = *(undefined4 *)((long)local_3e8.data + 4);
          *(undefined4 *)(puVar9 + 1) = *local_3e8.data;
          *(undefined4 *)((long)puVar9 + 0xc) = *(undefined4 *)((long)local_3e8.data + 4);
          uVar1 = *local_318.data;
          *(undefined4 *)puVar10 = uVar1;
          *(undefined4 *)((long)puVar10 + 4) = uVar1;
          uVar1 = *(undefined4 *)((long)local_318.data + 4);
          *(undefined4 *)(puVar10 + 1) = uVar1;
          *(undefined4 *)((long)puVar10 + 0xc) = uVar1;
          local_288.data = (void *)((ulong)local_288.data & 0xffffffff00000000);
          std::vector<float,_std::allocator<float>_>::resize
                    (&local_218,8,(value_type_conflict1 *)&local_288);
          lVar12 = 0;
          do {
            fVar26 = *(float *)((long)puVar10 + lVar12 * 4);
            local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[lVar12 * 2] = *(float *)((long)puVar9 + lVar12 * 4);
            local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[lVar12 * 2 + 1] = fVar26;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 4);
          operator_delete(puVar10);
          operator_delete(puVar9);
          if ((undefined4 *)local_318.data != (undefined4 *)0x0) {
            operator_delete(local_318.data);
          }
          if ((pair<int,_int>)local_3e8.data != (pair<int,_int>)0x0) {
            operator_delete(local_3e8.data);
          }
          local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          uVar24 = *(uint *)(local_2c8._0_8_ + (long)local_3f0 * 8);
          iVar7 = *(int *)(local_2c8._0_8_ + 4 + (long)local_3f0 * 8);
          lVar12 = (long)iVar7;
          iVar16 = *(int *)((long)local_368 + (long)local_3f0 * 4);
          std::vector<float,_std::allocator<float>_>::vector(&local_200,&local_218);
          uVar23 = (ulong)uVar24;
          local_3e8._0_16_ = ZEXT816(0);
          local_3e8.elemsize._0_4_ = 0;
          local_3e8.elemsize._4_4_ = 0;
          local_318.elemsize._0_4_ = 0;
          local_318.elemsize._4_4_ = 0;
          local_318.data = (void *)0x0;
          local_318.refcount._0_4_ = 0;
          local_318.refcount._4_4_ = 0;
          local_408 = (double)iVar16;
          if (0 < (int)uVar24) {
            uVar15 = 0;
            do {
              fVar26 = (float)(((double)(int)uVar15 + 0.5) * local_408);
              local_288.data = (void *)CONCAT44(local_288.data._4_4_,fVar26);
              if (local_3e8.refcount == (int *)local_3e8.elemsize) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&local_3e8,
                           (iterator)local_3e8.refcount,(float *)&local_288);
              }
              else {
                *local_3e8.refcount = (int)fVar26;
                local_3e8.refcount = (int *)((long)local_3e8.refcount + 4);
              }
              uVar15 = uVar15 + 1;
            } while (uVar24 != uVar15);
          }
          if (0 < iVar7) {
            iVar16 = 0;
            do {
              fVar26 = (float)(((double)iVar16 + 0.5) * local_408);
              local_288.data = (void *)CONCAT44(local_288.data._4_4_,fVar26);
              if ((float *)local_318.refcount ==
                  (float *)CONCAT44(local_318.elemsize._4_4_,(undefined4)local_318.elemsize)) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&local_318,
                           (iterator)local_318.refcount,(float *)&local_288);
              }
              else {
                *local_318.refcount = (int)fVar26;
                local_318.refcount = (int *)((float *)local_318.refcount + 1);
              }
              iVar16 = iVar16 + 1;
            } while (iVar7 != iVar16);
          }
          __n = lVar12 * (int)uVar24;
          local_398._0_4_ = 0.0;
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_288,__n,
                     (value_type_conflict1 *)local_398,(allocator_type *)&local_190);
          local_190 = (void *)((ulong)local_190 & 0xffffffff00000000);
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)local_398,__n,
                     (value_type_conflict1 *)&local_190,(allocator_type *)&local_410);
          auVar30 = _DAT_00514050;
          auVar5 = _DAT_00514040;
          auVar31 = _DAT_00514030;
          if (0 < iVar7) {
            lVar18 = 0;
            pvVar14 = local_288.data;
            do {
              if (0 < (int)uVar24) {
                uVar19 = 0;
                do {
                  *(undefined4 *)((long)pvVar14 + uVar19 * 4) =
                       *(undefined4 *)((long)local_3e8.data + uVar19 * 4);
                  uVar19 = uVar19 + 1;
                } while (uVar23 != uVar19);
              }
              lVar18 = lVar18 + 1;
              pvVar14 = (void *)((long)pvVar14 + uVar23 * 4);
            } while (lVar18 != lVar12);
            lVar18 = uVar23 - 1;
            auVar29._8_4_ = (int)lVar18;
            auVar29._0_8_ = lVar18;
            auVar29._12_4_ = (int)((ulong)lVar18 >> 0x20);
            lVar18 = CONCAT44(local_398._4_4_,local_398._0_4_) + 0xc;
            lVar22 = 0;
            do {
              if (0 < (int)uVar24) {
                uVar1 = *(undefined4 *)((long)local_318.data + lVar22 * 4);
                lVar20 = 0;
                auVar32 = auVar5;
                auVar34 = auVar31;
                do {
                  auVar35 = auVar29 ^ auVar30;
                  auVar36 = auVar32 ^ auVar30;
                  iVar16 = auVar35._4_4_;
                  if ((bool)(~(iVar16 < auVar36._4_4_ ||
                              auVar35._0_4_ < auVar36._0_4_ && auVar36._4_4_ == iVar16) & 1)) {
                    *(undefined4 *)(lVar18 + -0xc + lVar20) = uVar1;
                  }
                  if (auVar36._12_4_ <= auVar35._12_4_ &&
                      (auVar36._8_4_ <= auVar35._8_4_ || auVar36._12_4_ != auVar35._12_4_)) {
                    *(undefined4 *)(lVar18 + -8 + lVar20) = uVar1;
                  }
                  iVar37 = SUB164(auVar34 ^ auVar30,4);
                  if (iVar37 <= iVar16 &&
                      (iVar37 != iVar16 || SUB164(auVar34 ^ auVar30,0) <= auVar35._0_4_)) {
                    *(undefined4 *)(lVar18 + -4 + lVar20) = uVar1;
                    *(undefined4 *)(lVar18 + lVar20) = uVar1;
                  }
                  lVar33 = auVar32._8_8_;
                  auVar32._0_8_ = auVar32._0_8_ + 4;
                  auVar32._8_8_ = lVar33 + 4;
                  lVar33 = auVar34._8_8_;
                  auVar34._0_8_ = auVar34._0_8_ + 4;
                  auVar34._8_8_ = lVar33 + 4;
                  lVar20 = lVar20 + 0x10;
                } while ((ulong)(uVar24 + 3 >> 2) << 4 != lVar20);
              }
              lVar22 = lVar22 + 1;
              lVar18 = lVar18 + uVar23 * 4;
            } while (lVar22 != lVar12);
          }
          local_410 = 0.0;
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_190,__n * 2,&local_410,
                     &local_409);
          uVar24 = uVar24 * iVar7;
          if (0 < (int)uVar24) {
            uVar23 = 0;
            do {
              *(undefined4 *)((long)local_190 + uVar23 * 8) =
                   *(undefined4 *)((long)local_288.data + uVar23 * 4);
              *(undefined4 *)((long)local_190 + uVar23 * 8 + 4) =
                   *(undefined4 *)(CONCAT44(local_398._4_4_,local_398._0_4_) + uVar23 * 4);
              uVar23 = uVar23 + 1;
            } while (uVar24 != uVar23);
          }
          local_410 = 0.0;
          std::vector<float,_std::allocator<float>_>::resize
                    (&local_238,
                     __n * ((long)local_200.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_200.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 2) &
                     0x7fffffffffffffff,&local_410);
          if (0 < (int)uVar24) {
            uVar23 = (long)local_200.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_200.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2;
            uVar19 = 0;
            uVar21 = 0;
            do {
              if (1 < uVar23) {
                uVar17 = 0;
                uVar25 = uVar19;
                do {
                  fVar26 = local_200.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar17 * 2 + 1];
                  fVar2 = *(float *)((long)local_190 + (uVar21 * 2 + 1) * 4);
                  local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[(uVar19 & 0xfffffffffffffffe) + uVar17 * 2] =
                       local_200.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar17 * 2] +
                       *(float *)((long)local_190 + uVar21 * 8);
                  *(float *)((long)local_238.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + (uVar25 * 4 | 4)) =
                       fVar26 + fVar2;
                  uVar17 = uVar17 + 1;
                  uVar25 = uVar25 + 2;
                } while (uVar23 >> 1 != uVar17);
              }
              uVar21 = uVar21 + 1;
              uVar19 = uVar19 + uVar23;
            } while (uVar21 != uVar24);
          }
          if (local_190 != (void *)0x0) {
            operator_delete(local_190);
          }
          if ((void *)CONCAT44(local_398._4_4_,local_398._0_4_) != (void *)0x0) {
            operator_delete((void *)CONCAT44(local_398._4_4_,local_398._0_4_));
          }
          if (local_288.data != (void *)0x0) {
            operator_delete(local_288.data);
          }
          if (local_318.data != (void *)0x0) {
            operator_delete(local_318.data);
          }
          if ((pair<int,_int>)local_3e8.data != (pair<int,_int>)0x0) {
            operator_delete(local_3e8.data);
          }
          if (local_200.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_200.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          std::vector<float,std::allocator<float>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                    ((vector<float,std::allocator<float>> *)local_348,local_348._8_8_,
                     local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          if (local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          dVar27 = (double)((long)local_3f0 + 1);
        } while ((ulong)dVar27 < (ulong)((long)local_378 - local_398._24_8_ >> 2));
      }
      if ((Point)local_368 != (Point)0x0) {
        operator_delete((void *)local_368);
      }
      if ((void *)local_2c8._0_8_ != (void *)0x0) {
        operator_delete((void *)local_2c8._0_8_);
      }
      if ((Allocator *)local_398._24_8_ != (Allocator *)0x0) {
        operator_delete((void *)local_398._24_8_);
      }
      local_3e8.refcount = (int *)0x0;
      local_3e8.data = (void *)local_348._0_8_;
      local_3e8.elemsize._0_4_ = 4;
      local_3e8.elemsize._4_4_ = 0;
      local_3e8.elempack = 1;
      local_3e8.allocator = (Allocator *)0x0;
      local_3e8.dims = 2;
      local_3e8.w = 2;
      local_3e8.h = (int)((ulong)(local_348._8_8_ - local_348._0_8_) >> 3);
      local_3e8.d = 1;
      local_3e8.c = 1;
      local_3e8.cstep = (long)local_3e8.h * 2;
      ncnn::Net::create_extractor((Net *)local_398);
      local_190 = (void *)0x42e88f5c42f7599a;
      local_188 = 0x42cf0f5c;
      local_2c8._8_4_ = 0x3c8ec7a9;
      local_2c8._0_8_ = 0x3c8f5c293c8c4934;
      ncnn::Mat::substract_mean_normalize(&local_1e8,(float *)&local_190,(float *)local_2c8);
      ncnn::Extractor::input((Extractor *)local_398,"input",&local_1e8);
      ncnn::Extractor::input((Extractor *)local_398,"anchor",&local_3e8);
      local_318.cstep = 0;
      local_318.data = (void *)0x0;
      local_318.refcount._0_4_ = 0;
      local_318.refcount._4_4_ = 0;
      local_318.elemsize._0_4_ = 0;
      local_318.elemsize._4_4_ = 0;
      local_318.elempack = 0;
      local_318.allocator = (Allocator *)0x0;
      local_318.dims = 0;
      local_318.w = 0;
      local_318.h = 0;
      local_318.d = 0;
      local_318.c = 0;
      local_288.cstep = 0;
      local_288.data = (void *)0x0;
      local_288.refcount._0_4_ = 0;
      local_288.refcount._4_4_ = 0;
      local_288.elemsize._0_4_ = 0;
      local_288.elemsize._4_4_ = 0;
      local_288.elempack = 0;
      local_288.allocator = (Allocator *)0x0;
      local_288.dims = 0;
      local_288.w = 0;
      local_288.h = 0;
      local_288.d = 0;
      local_288.c = 0;
      ncnn::Extractor::extract((Extractor *)local_398,"pred_scores",&local_318,0);
      ncnn::Extractor::extract((Extractor *)local_398,"pred_points",&local_288,0);
      if (0 < local_288.h) {
        local_408._0_4_ = (float)local_f8;
        local_408._4_4_ = (float)iStack_f4;
        fStack_400 = (float)iStack_f0;
        fStack_3fc = (float)iStack_ec;
        local_328 = (double)CONCAT44((float)local_e8._4_4_,(float)(int)local_e8);
        uStack_320 = CONCAT44((float)uStack_e0._4_4_,(float)(int)uStack_e0);
        lVar12 = 0;
        do {
          auVar5 = _local_368;
          auVar30._8_8_ = 0;
          auVar30._0_8_ =
               *(ulong *)((long)local_288.data +
                         local_288.w * lVar12 *
                         CONCAT44(local_288.elemsize._4_4_,(undefined4)local_288.elemsize));
          auVar31._4_4_ = local_408._4_4_;
          auVar31._0_4_ = (float)local_408;
          auVar31._8_4_ = fStack_400;
          auVar31._12_4_ = fStack_3fc;
          auVar31 = divps(auVar30,auVar31);
          local_368._4_4_ = (int)(auVar31._4_4_ * local_328._4_4_);
          local_368._0_4_ = (int)(auVar31._0_4_ * (float)local_328);
          iStack_360._M_current._4_4_ = auVar5._12_4_;
          iStack_360._M_current._0_4_ =
               *(float *)((long)local_318.data +
                         local_318.w * lVar12 *
                         CONCAT44(local_318.elemsize._4_4_,(undefined4)local_318.elemsize) + 4);
          std::vector<CrowdPoint,_std::allocator<CrowdPoint>_>::push_back
                    (&local_2a8,(value_type *)local_368);
          lVar12 = lVar12 + 1;
        } while (lVar12 < local_288.h);
      }
      piVar4 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_288.allocator == (Allocator *)0x0) {
            if (local_288.data != (void *)0x0) {
              free(local_288.data);
            }
          }
          else {
            (*(local_288.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar4 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_318.allocator == (Allocator *)0x0) {
            if (local_318.data != (void *)0x0) {
              free(local_318.data);
            }
          }
          else {
            (*(local_318.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Extractor::~Extractor((Extractor *)local_398);
      if (local_3e8.refcount != (int *)0x0) {
        LOCK();
        *local_3e8.refcount = *local_3e8.refcount + -1;
        UNLOCK();
        if (*local_3e8.refcount == 0) {
          if (local_3e8.allocator == (Allocator *)0x0) {
            if ((pair<int,_int>)local_3e8.data != (pair<int,_int>)0x0) {
              free(local_3e8.data);
            }
          }
          else {
            (*(local_3e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if ((void *)local_348._0_8_ != (void *)0x0) {
        operator_delete((void *)local_348._0_8_);
      }
      if ((pointer)local_178._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_178._0_8_);
      }
      if (local_1e8.refcount != (int *)0x0) {
        LOCK();
        *local_1e8.refcount = *local_1e8.refcount + -1;
        UNLOCK();
        if (*local_1e8.refcount == 0) {
          if (local_1e8.allocator == (Allocator *)0x0) {
            if ((size_t *)local_1e8.data != (size_t *)0x0) {
              free(local_1e8.data);
            }
          }
          else {
            (*(local_1e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&local_158);
      cv::Mat::clone();
      if (local_2a8.super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_2a8.super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar12 = 8;
        uVar23 = 0;
        pCVar11 = local_2a8.super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pCVar13 = local_2a8.super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        do {
          if (0.5 < *(float *)((long)&(pCVar11->pt).x + lVar12)) {
            local_3e8.elemsize._0_4_ = 0;
            local_3e8.elemsize._4_4_ = 0;
            local_3e8.data._0_4_ = 0x3010000;
            local_3e8.refcount = (int *)&local_158;
            local_318.data = *(void **)((long)pCVar11 + lVar12 + -8);
            local_1e8.data = (void *)0x0;
            local_1e8.refcount = (int *)0x0;
            local_1e8.elemsize = 0x406fe00000000000;
            local_1e8.elempack = 0;
            local_1e8._28_4_ = 0;
            cv::circle(&local_3e8,&local_318,4,&local_1e8,0xffffffff,8,0);
            pCVar11 = local_2a8.super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pCVar13 = local_2a8.super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          uVar23 = uVar23 + 1;
          uVar19 = ((long)pCVar13 - (long)pCVar11 >> 2) * -0x5555555555555555;
          lVar12 = lVar12 + 0xc;
        } while (uVar23 <= uVar19 && uVar19 - uVar23 != 0);
      }
      local_1e8.elemsize = CONCAT26(local_1e8.elemsize._6_2_,0x6567616d69);
      local_1e8.refcount = (int *)0x5;
      local_3e8.elemsize._0_4_ = 0;
      local_3e8.elemsize._4_4_ = 0;
      local_3e8.data._0_4_ = 0x1010000;
      local_3e8.refcount = (int *)&local_158;
      local_1e8.data = &local_1e8.elemsize;
      cv::imshow((string *)&local_1e8,(_InputArray *)&local_3e8);
      if ((size_t *)local_1e8.data != &local_1e8.elemsize) {
        operator_delete(local_1e8.data);
      }
      cv::waitKey(0);
      cv::Mat::~Mat((Mat *)&local_158);
      if (local_2a8.super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2a8.super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      iVar7 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar3);
      iVar7 = -1;
    }
    cv::Mat::~Mat((Mat *)local_90);
  }
  else {
    main_cold_1();
    iVar7 = -1;
  }
  return iVar7;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat bgr = cv::imread(imagepath, 1);
    if (bgr.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<CrowdPoint> crowd_points;
    detect_crowd(bgr, crowd_points);
    draw_result(bgr, crowd_points);

    return 0;
}